

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  uint blocks;
  char *pcVar2;
  ostream *poVar3;
  allocator<char> local_31;
  string method;
  
  pcVar2 = getenv("BLOCKS");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "BLOCKS not defined";
  }
  else {
    blocks = atoi(pcVar2);
    pcVar2 = getenv("METHOD");
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&method,pcVar2,&local_31);
      bVar1 = std::operator==(&method,"UniformSampling");
      if (bVar1) {
        uniform_sampling(blocks);
LAB_00108c5f:
        std::__cxx11::string::~string((string *)&method);
        return 0;
      }
      bVar1 = std::operator==(&method,"CanonicSampling");
      if (bVar1) {
        canonic_sampling(blocks);
        goto LAB_00108c5f;
      }
      bVar1 = std::operator==(&method,"WangLandau");
      if (bVar1) {
        wang_landau(blocks);
        goto LAB_00108c5f;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"METHOD not valid");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00108c9e;
    }
    pcVar2 = "METHOD not defined";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00108c9e:
  exit(1);
}

Assistant:

int main() {
    char *env_blocks = getenv("BLOCKS");
    if (env_blocks == NULL) {std::cout << "BLOCKS not defined" << std::endl; exit(1);}
    unsigned int blocks = (unsigned int)atoi(env_blocks);

    char *env_method = std::getenv("METHOD");
    if (env_method == NULL) {std::cout << "METHOD not defined" << std::endl; exit(1);}
    std::string method = std::string(env_method);

    if (method == "UniformSampling")
        uniform_sampling(blocks);
    else if (method == "CanonicSampling")
        canonic_sampling(blocks);
    else if (method == "WangLandau")
        wang_landau(blocks);
    else {
        std::cout << "METHOD not valid" << std::endl;
        exit(1);
    }
    return 0;
}